

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [14])

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this_00;
  size_t sVar1;
  Message local_30;
  
  this_00.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 operator_new(0x188);
  std::__cxx11::stringstream::stringstream((stringstream *)this_00.ptr_);
  *(undefined8 *)(this_00.ptr_ + *(long *)(*(long *)(this_00.ptr_ + 0x10) + -0x18) + 0x18) = 0x11;
  local_30.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )this_00.ptr_;
  sVar1 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this_00.ptr_ + 0x10),*value,sVar1);
  AppendMessage(this,&local_30);
  if (local_30.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30.ss_.ptr_ + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }